

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall
ki::protocol::dml::Message::set_template(Message *this,MessageTemplate *message_template)

{
  bool bVar1;
  Record *this_00;
  Record *record;
  char *pcVar2;
  size_type sVar3;
  ostringstream oss;
  parse_error *e;
  string local_1c8 [32];
  istringstream local_1a8 [8];
  istringstream iss;
  MessageTemplate *message_template_local;
  Message *this_local;
  
  this->m_template = message_template;
  if (this->m_template != (MessageTemplate *)0x0) {
    this_00 = (Record *)operator_new(0x50);
    record = MessageTemplate::get_record(message_template);
    ki::dml::Record::Record(this_00,record);
    this->m_record = this_00;
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->m_raw_data);
    if (!bVar1) {
      pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->m_raw_data);
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->m_raw_data);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,pcVar2,sVar3,(allocator *)((long)&e + 7));
      std::__cxx11::istringstream::istringstream(local_1a8,local_1c8,_S_in);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
      ki::dml::Record::read_from(this->m_record,(istream *)local_1a8);
      std::vector<char,_std::allocator<char>_>::clear(&this->m_raw_data);
      std::__cxx11::istringstream::~istringstream(local_1a8);
    }
  }
  return;
}

Assistant:

void Message::set_template(const MessageTemplate *message_template)
	{
		m_template = message_template;
		if (!m_template)
			return;

		m_record = new ki::dml::Record(message_template->get_record());
		if (!m_raw_data.empty())
		{
			std::istringstream iss(std::string(m_raw_data.data(), m_raw_data.size()));
			try
			{
				m_record->read_from(iss);
				m_raw_data.clear();
			}
			catch (ki::dml::parse_error &e)
			{
				delete m_record;
				m_template = nullptr;
				m_record = nullptr;

				std::ostringstream oss;
				oss << "Error reading DML message payload: " << e.what();
				throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
			}
		}
	}